

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O2

int32_t conv_mcnpx_pdg2ssw(int32_t c)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int32_t *piVar5;
  long lVar6;
  uint uVar7;
  
  uVar1 = c;
  if (c < 1) {
    uVar1 = -c;
  }
  if ((int)uVar1 < 0x3b9b1849) {
    piVar5 = conv_mcnpx_to_pdg_0to34;
    for (uVar4 = 0; uVar4 != 0x23; uVar4 = uVar4 + 1) {
      if (*piVar5 == c) goto LAB_00103759;
      piVar5 = piVar5 + 1;
    }
    uVar4 = 400;
    for (lVar6 = 0; lVar6 != 0x8c; lVar6 = lVar6 + 4) {
      if (*(uint *)((long)conv_mcnpx_to_pdg_0to34 + lVar6) == -c) goto LAB_00103759;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
  }
  uVar4 = 0;
  if (uVar1 + 0xc46535ff < 0x989676) {
    uVar4 = 0;
    iVar2 = (int)(((ulong)uVar1 / 10000) % 1000);
    uVar7 = (uint)(((ulong)uVar1 / 10) % 1000);
    if (iVar2 - 1U < uVar7 && uVar1 % 10 == 0) {
      iVar2 = iVar2 * 1000000;
      iVar3 = iVar2 + -0xf408d;
      if (-1 < c) {
        iVar3 = iVar2 + -0xf421d;
      }
      uVar4 = (ulong)(iVar3 + uVar7 * 1000);
    }
  }
LAB_00103759:
  return (int32_t)uVar4;
}

Assistant:

int32_t conv_mcnpx_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    int i;
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i]==c)
        return i;
    }
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i] == -c)
        return 400+i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( I || !A || !Z || Z>A )
      return 0;
    return (Z-1)*1000000 + A*1000 + ( c<0 ? 435 : 35 );
  }
  return 0;
}